

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint64_t farmhashxo::Hash64(char *s,size_t len)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar13 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                   (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar13 >> 0x2f ^ uVar13) * -0x651e95c4d06fbfb1;
        }
        lVar8 = len * 2 + -0x651e95c4d06fbfb1;
        uVar13 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar8;
        uVar13 = (uVar13 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar13) * lVar8;
        uVar13 = uVar13 >> 0x2f ^ uVar13;
      }
      else {
        uVar13 = *(ulong *)(s + (len - 8));
        lVar8 = len * 2 + -0x651e95c4d06fbfb1;
        uVar4 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar5 = ((uVar4 >> 0x19 | uVar4 << 0x27) + uVar13) * lVar8;
        uVar13 = ((uVar13 >> 0x25 | uVar13 << 0x1b) * lVar8 + uVar4 ^ uVar5) * lVar8;
        uVar13 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar8;
        uVar13 = uVar13 >> 0x2f ^ uVar13;
      }
    }
    else {
      lVar8 = len * 2 + -0x651e95c4d06fbfb1;
      uVar5 = *(long *)(s + (len - 8)) * lVar8;
      uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar4 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar5;
      uVar13 = ((uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
                *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar4) * lVar8;
      uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar8;
      uVar13 = uVar13 >> 0x2f ^ uVar13;
    }
LAB_0017b5be:
    return uVar13 * lVar8;
  }
  if (len < 0x41) {
    lVar8 = len * 2 + -0x651e95c4d06fbfcf;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)(s + (len - 0x20));
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)s;
    auVar26 = vpunpcklqdq_avx(auVar26,auVar28);
    auVar27._8_8_ = 0xb492b66fbe98f273;
    auVar27._0_8_ = 0xb492b66fbe98f273;
    auVar22 = vpmullq_avx512vl(auVar26,auVar27);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)(s + 0x10);
    auVar26 = vpunpcklqdq_avx(auVar24,auVar25);
    auVar31._8_8_ = 0x9ae16a3b2f90404f;
    auVar31._0_8_ = 0x9ae16a3b2f90404f;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)(s + (len - 0x18));
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(s + 8);
    auVar27 = vpunpcklqdq_avx(auVar32,auVar33);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)(s + (len - 8));
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(s + 0x18);
    auVar30 = vpunpcklqdq_avx(auVar30,auVar23);
    auVar29._8_8_ = 0x9ae16a3b2f904031;
    auVar29._0_8_ = 0x9ae16a3b2f904031;
    auVar23 = vpmullq_avx512vl(auVar26,auVar31);
    auVar26 = vpaddq_avx(auVar27,auVar31);
    auVar24 = vprolq_avx512vl(auVar26,0x2e);
    auVar26 = vpaddq_avx(auVar22,auVar27);
    auVar25 = vprolq_avx512vl(auVar26,0x15);
    auVar28 = vpinsrq_avx(auVar29,lVar8,0);
    auVar26 = vpmullq_avx512vl(auVar30,auVar28);
    auVar27 = vprolq_avx512vl(auVar26,0x22);
    auVar26 = vpaddq_avx(auVar24,auVar26);
    auVar26 = vpaddq_avx(auVar26,auVar22);
    auVar27 = vpaddq_avx(auVar27,auVar23);
    auVar27 = vpaddq_avx(auVar27,auVar25);
    auVar27 = vpmullq_avx512vl(auVar27 ^ auVar26,auVar28);
    auVar30 = vpsrlq_avx(auVar27,0x2f);
    auVar26 = vpternlogq_avx512vl(auVar30,auVar26,auVar27,0x96);
    auVar26 = vpmullq_avx512vl(auVar26,auVar28);
    auVar27 = vpsrlq_avx(auVar26,0x2f);
    lVar6 = vpextrq_avx(auVar27 ^ auVar26,1);
    uVar13 = lVar6 + SUB168(auVar27 ^ auVar26,0) * lVar8;
    goto LAB_0017b5be;
  }
  if (len < 0x61) {
    lVar8 = len * 2 + -0x651e95c4d06fc023;
    uVar4 = *(long *)(s + 0x18) * -0x651e95c4d06fc023;
    uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar5 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar5 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar4;
    uVar13 = ((uVar4 >> 0x1e | uVar4 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
              *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 ^ uVar5) * -0x651e95c4d06fc023;
    uVar21 = *(long *)(s + 0x38) * lVar8;
    uVar5 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * -0x651e95c4d06fc023;
    uVar13 = *(long *)(s + 0x20) * -0x4b6d499041670d8d + *(long *)(s + 0x28);
    uVar4 = *(long *)(s + 0x28) + 0x9ae16a3b2f90404f;
    uVar18 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)(s + 0x20) * -0x4b6d499041670d8d + uVar21;
    uVar4 = *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d + *(long *)(s + (len - 0x18));
    uVar12 = *(long *)(s + (len - 0x18)) + 0x9ae16a3b2f90404f;
    uVar13 = ((uVar21 >> 0x1e | uVar21 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
              *(long *)(s + 0x30) * -0x651e95c4d06fbfb1 ^ uVar18) * lVar8;
    uVar21 = *(long *)(s + (len - 8)) * lVar8;
    uVar13 = (uVar13 >> 0x2f ^ uVar18 ^ uVar13) * lVar8;
    uVar12 = (uVar12 >> 0x12 | uVar12 << 0x2e) + *(long *)(s + (len - 0x20)) * -0x4b6d499041670d8d +
             uVar21 + (uVar13 >> 0x2f ^ uVar13);
    uVar4 = ((uVar21 >> 0x1e | uVar21 << 0x22) + (uVar4 >> 0x2b | uVar4 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 + (uVar5 >> 0x2f ^ uVar5) ^ uVar12) *
            lVar8;
    uVar4 = (uVar4 >> 0x2f ^ uVar12 ^ uVar4) * lVar8;
    return ((uVar13 >> 0x15) + (uVar5 >> 0x11) + (uVar4 >> 0x2f ^ uVar4) * 9) * lVar8;
  }
  if (0x100 < len) {
    uVar7 = farmhashuo::Hash64(s,len);
    return uVar7;
  }
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar13 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                   (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar13 >> 0x2f ^ uVar13) * -0x651e95c4d06fbfb1;
        }
        lVar8 = len * 2 + -0x651e95c4d06fbfb1;
        uVar13 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar8;
        uVar13 = (uVar13 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar13) * lVar8;
        uVar13 = uVar13 >> 0x2f ^ uVar13;
      }
      else {
        uVar13 = *(ulong *)(s + (len - 8));
        lVar8 = len * 2 + -0x651e95c4d06fbfb1;
        uVar4 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar5 = ((uVar4 >> 0x19 | uVar4 << 0x27) + uVar13) * lVar8;
        uVar13 = ((uVar13 >> 0x25 | uVar13 << 0x1b) * lVar8 + uVar4 ^ uVar5) * lVar8;
        uVar13 = (uVar13 >> 0x2f ^ uVar5 ^ uVar13) * lVar8;
        uVar13 = uVar13 >> 0x2f ^ uVar13;
      }
      goto LAB_0017ac50;
    }
    lVar8 = len * 2 + -0x651e95c4d06fbfb1;
    uVar4 = *(long *)(s + (len - 8)) * lVar8;
    uVar13 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar5 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar13 = (uVar4 >> 0x1e | uVar4 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar4 = (uVar5 >> 0x12 | uVar5 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar4;
  }
  else {
    if (0x40 < len) {
      uVar4 = len - 1 & 0xffffffffffffffc0;
      uVar13 = (ulong)((uint)(len - 1) & 0x3f);
      if (s + (len - 0x40) == s + (uVar13 - 0x3f) + uVar4) {
        lVar15 = *(long *)s + 0x1529cba0ca458ff;
        lVar8 = uVar13 + uVar4;
        lVar16 = 0x226bb95b4e64b6d4;
        uVar12 = 0x134a747f856d0526;
        uVar18 = 0;
        lVar14 = 0;
        uVar5 = 0;
        lVar20 = 0;
        lVar6 = 0;
        do {
          lVar1 = uVar18 + 0x30;
          lVar11 = uVar18 + 0x28;
          lVar2 = uVar18 + 0x10;
          lVar10 = lVar6 * -0x4b6d499041670d8d + *(long *)(s + uVar18);
          uVar17 = lVar16 + lVar6 + *(long *)(s + lVar1);
          uVar21 = lVar15 + lVar20 + lVar16 + *(long *)(s + uVar18 + 8);
          uVar19 = *(long *)(s + uVar18 + 8) + lVar10 + *(long *)(s + lVar2);
          lVar16 = lVar20 + *(long *)(s + lVar11) +
                   (uVar17 >> 0x2a | uVar17 * 0x400000) * -0x4b6d499041670d8d;
          lVar6 = uVar18 + 0x18;
          lVar15 = (uVar12 + lVar14 >> 0x21 | (uVar12 + lVar14) * 0x80000000) * -0x4b6d499041670d8d;
          uVar12 = (uVar21 >> 0x25 | uVar21 * 0x8000000) * -0x4b6d499041670d8d ^ uVar5;
          lVar9 = uVar5 + lVar15 + *(long *)(s + uVar18 + 0x20);
          lVar20 = uVar19 + *(long *)(s + lVar6);
          lVar3 = uVar18 + 0x38;
          uVar18 = uVar18 + 0x40;
          uVar5 = lVar14 + lVar10 + *(long *)(s + lVar6) + uVar12;
          uVar21 = *(long *)(s + lVar11) + *(long *)(s + lVar1) + lVar9;
          lVar6 = lVar10 + (uVar19 >> 0x2c | uVar19 * 0x100000) + (uVar5 >> 0x15 | uVar5 << 0x2b);
          uVar5 = *(long *)(s + lVar2) + lVar9 + lVar16 + *(long *)(s + lVar3);
          lVar14 = uVar21 + *(long *)(s + lVar3);
          uVar5 = lVar9 + (uVar21 >> 0x2c | uVar21 * 0x100000) + (uVar5 >> 0x15 | uVar5 << 0x2b);
        } while (uVar4 != uVar18);
        lVar1 = (uVar12 & 0xff) * 2 + -0x4b6d499041670d8d;
        lVar20 = lVar20 + lVar14 + uVar13;
        lVar11 = lVar6 * lVar1 + *(long *)(s + lVar8 + -0x3f);
        lVar14 = lVar14 + uVar13 + lVar20;
        uVar12 = uVar12 + lVar14;
        uVar4 = lVar16 + lVar6 + *(long *)(s + lVar8 + -0xf);
        uVar13 = lVar15 + lVar16 + *(long *)(s + lVar8 + -0x37) + lVar20;
        uVar17 = *(long *)(s + lVar8 + -0x37) + *(long *)(s + lVar8 + -0x2f) + lVar11;
        uVar21 = lVar20 * 9 + *(long *)(s + lVar8 + -0x17) +
                 (uVar4 >> 0x2a | uVar4 * 0x400000) * lVar1;
        uVar18 = uVar5 * 9 ^ (uVar13 >> 0x25 | uVar13 * 0x8000000) * lVar1;
        uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
        lVar6 = uVar12 * lVar1 + uVar5 + *(long *)(s + lVar8 + -0x1f);
        uVar5 = lVar14 + lVar11 + uVar18 + *(long *)(s + lVar8 + -0x27);
        uVar13 = *(long *)(s + lVar8 + -0x17) + *(long *)(s + lVar8 + -0xf) + lVar6;
        uVar4 = uVar13 + *(long *)(s + lVar8 + -7);
        uVar19 = *(long *)(s + lVar8 + -0x2f) + uVar21 + *(long *)(s + lVar8 + -7) + lVar6;
        uVar13 = (uVar13 >> 0x2c | uVar13 * 0x100000) + lVar6 + (uVar19 >> 0x15 | uVar19 << 0x2b);
        uVar19 = (uVar17 + *(long *)(s + lVar8 + -0x27) ^ uVar4) * lVar1;
        uVar5 = ((uVar17 >> 0x2c | uVar17 * 0x100000) + lVar11 + (uVar5 >> 0x15 | uVar5 << 0x2b) ^
                uVar13) * lVar1;
        uVar4 = (uVar19 >> 0x2f ^ uVar4 ^ uVar19) * lVar1;
        uVar13 = (uVar5 >> 0x2f ^ uVar13 ^ uVar5) * lVar1;
        uVar13 = ((uVar13 >> 0x2f ^ uVar13) + uVar12) * lVar1;
        uVar4 = ((uVar21 >> 0x2f ^ uVar21) * -0x3c5a37a36834ced9 + uVar18 +
                 (uVar4 >> 0x2f ^ uVar4) * lVar1 ^ uVar13) * lVar1;
        uVar13 = (uVar4 >> 0x2f ^ uVar13 ^ uVar4) * lVar1;
        return (uVar13 >> 0x2f ^ uVar13) * lVar1;
      }
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                    ,0x226,"uint64_t farmhashna::Hash64(const char *, size_t)");
    }
    lVar8 = len * 2 + -0x651e95c4d06fbfb1;
    lVar6 = *(long *)s * -0x651e95c4d06fbfb1;
    uVar5 = *(long *)(s + (len - 8)) * lVar8;
    uVar13 = lVar6 + *(long *)(s + 8);
    uVar12 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar4 = lVar6 + *(long *)(s + 0x18);
    uVar13 = (uVar5 >> 0x1e | uVar5 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
             *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar5 = (uVar12 >> 0x12 | uVar12 << 0x2e) + lVar6 + uVar5;
    uVar12 = (uVar13 ^ uVar5) * lVar8;
    uVar18 = (uVar13 + *(long *)(s + (len - 0x20))) * lVar8;
    uVar13 = *(long *)(s + 0x10) * lVar8 + *(long *)(s + 0x18);
    uVar5 = (uVar12 >> 0x2f ^ uVar5 ^ uVar12) * lVar8;
    uVar4 = (uVar4 >> 0x12 | uVar4 << 0x2e) + *(long *)(s + 0x10) * lVar8 + uVar18;
    uVar13 = (uVar18 >> 0x1e | uVar18 << 0x22) + (uVar13 >> 0x2b | uVar13 * 0x200000) +
             ((uVar5 >> 0x2f ^ uVar5) * lVar8 + *(long *)(s + (len - 0x18))) * lVar8;
  }
  uVar13 = (uVar13 ^ uVar4) * lVar8;
  uVar13 = (uVar13 >> 0x2f ^ uVar4 ^ uVar13) * lVar8;
  uVar13 = uVar13 >> 0x2f ^ uVar13;
LAB_0017ac50:
  return uVar13 * lVar8;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhashna::HashLen0to16(s, len);
    } else {
      return farmhashna::HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  } else if (len <= 96) {
    return HashLen65to96(s, len);
  } else if (len <= 256) {
    return farmhashna::Hash64(s, len);
  } else {
    return farmhashuo::Hash64(s, len);
  }
}